

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basisu_frontend.cpp
# Opt level: O3

void __thiscall
basisu::basisu_frontend::compute_selector_clusters_within_each_parent_cluster(basisu_frontend *this)

{
  vector<basisu::vector<unsigned_int>_> *this_00;
  byte bVar1;
  uint uVar2;
  void *__ptr;
  uint *puVar3;
  uint uVar4;
  long lVar5;
  long lVar6;
  uint *puVar7;
  vector<unsigned_int> *pvVar8;
  uint *puVar9;
  char *__function;
  uint32_t uVar10;
  ulong uVar11;
  uint32_t new_size;
  uint uVar12;
  ulong uVar13;
  uint *puVar14;
  uint32_t cluster_index;
  uint_vec block_selector_cluster_indices;
  uint local_4c;
  elemental_vector local_48;
  
  uVar10 = this->m_total_blocks;
  local_48.m_p = (void *)0x0;
  local_48.m_size = 0;
  local_48.m_capacity = 0;
  if (uVar10 != 0) {
    elemental_vector::increase_capacity(&local_48,uVar10,uVar10 == 1,4,(object_mover)0x0,false);
    memset((void *)((local_48._8_8_ & 0xffffffff) * 4 + (long)local_48.m_p),0,
           (ulong)(uVar10 - local_48.m_size) << 2);
    local_48.m_size = uVar10;
  }
  uVar10 = (this->m_selector_cluster_block_indices).m_size;
  if (0 < (int)uVar10) {
    lVar5 = 0;
    do {
      pvVar8 = (this->m_selector_cluster_block_indices).m_p;
      if (pvVar8[lVar5].m_size != 0) {
        pvVar8 = pvVar8 + lVar5;
        uVar11 = 0;
        do {
          uVar12 = pvVar8->m_p[uVar11];
          if (local_48.m_size <= uVar12) goto LAB_0022e426;
          *(int *)((long)local_48.m_p + (ulong)uVar12 * 4) = (int)lVar5;
          uVar11 = uVar11 + 1;
        } while (uVar11 < pvVar8->m_size);
        uVar10 = (this->m_selector_cluster_block_indices).m_size;
      }
      lVar5 = lVar5 + 1;
    } while (lVar5 < (int)uVar10);
  }
  this_00 = &this->m_selector_clusters_within_each_parent_cluster;
  uVar11 = (ulong)(this->m_selector_clusters_within_each_parent_cluster).m_size;
  if (uVar11 != 0) {
    pvVar8 = this_00->m_p;
    lVar5 = 0;
    do {
      __ptr = *(void **)((long)&pvVar8->m_p + lVar5);
      if (__ptr != (void *)0x0) {
        free(__ptr);
      }
      lVar5 = lVar5 + 0x10;
    } while (uVar11 << 4 != lVar5);
    (this->m_selector_clusters_within_each_parent_cluster).m_size = 0;
  }
  uVar12 = (this->m_selector_parent_cluster_block_indices).m_size;
  if (uVar12 != 0) {
    uVar4 = 0;
    if ((this->m_selector_clusters_within_each_parent_cluster).m_capacity < uVar12) {
      elemental_vector::increase_capacity
                ((elemental_vector *)this_00,uVar12,uVar12 == 1,0x10,(object_mover)0x0,false);
      uVar4 = (this->m_selector_clusters_within_each_parent_cluster).m_size;
    }
    if (uVar12 - uVar4 != 0) {
      memset(this_00->m_p + uVar4,0,(ulong)(uVar12 - uVar4) << 4);
    }
    (this->m_selector_clusters_within_each_parent_cluster).m_size = uVar12;
  }
  if (this->m_total_blocks != 0) {
    uVar11 = 0;
    do {
      if ((local_48._8_8_ & 0xffffffff) <= uVar11) {
LAB_0022e426:
        __function = "T &basisu::vector<unsigned int>::operator[](size_t) [T = unsigned int]";
LAB_0022e43b:
        __assert_fail("i < m_size",
                      "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/encoder/../transcoder/basisu_containers.h"
                      ,0x178,__function);
      }
      local_4c = *(uint *)((long)local_48.m_p + uVar11 * 4);
      if ((this->m_block_parent_selector_cluster).m_size <= uVar11) {
        __function = "T &basisu::vector<unsigned char>::operator[](size_t) [T = unsigned char]";
        goto LAB_0022e43b;
      }
      bVar1 = (this->m_block_parent_selector_cluster).m_p[uVar11];
      if ((this->m_selector_clusters_within_each_parent_cluster).m_size <= (uint)bVar1) {
        __function = 
        "T &basisu::vector<basisu::vector<unsigned int>>::operator[](size_t) [T = basisu::vector<unsigned int>]"
        ;
        goto LAB_0022e43b;
      }
      pvVar8 = this_00->m_p;
      puVar9 = pvVar8[bVar1].m_p;
      uVar12 = pvVar8[bVar1].m_size;
      uVar13 = (ulong)uVar12;
      if (&local_4c < puVar9 + uVar13 && (puVar9 <= &local_4c && puVar9 != (uint *)0x0)) {
        __assert_fail("!m_p || (&obj < m_p) || (&obj >= (m_p + m_size))",
                      "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/encoder/../transcoder/basisu_containers.h"
                      ,0x267,
                      "void basisu::vector<unsigned int>::push_back(const T &) [T = unsigned int]");
      }
      pvVar8 = pvVar8 + bVar1;
      if (pvVar8->m_capacity <= uVar12) {
        elemental_vector::increase_capacity
                  ((elemental_vector *)pvVar8,uVar12 + 1,true,4,(object_mover)0x0,false);
        puVar9 = pvVar8->m_p;
        uVar13 = (ulong)pvVar8->m_size;
      }
      puVar9[uVar13] = local_4c;
      pvVar8->m_size = pvVar8->m_size + 1;
      uVar11 = uVar11 + 1;
    } while (uVar11 < this->m_total_blocks);
    uVar12 = (this->m_selector_clusters_within_each_parent_cluster).m_size;
  }
  if (uVar12 != 0) {
    uVar12 = 0;
    do {
      uVar4 = this_00->m_p[uVar12].m_size;
      uVar11 = (ulong)uVar4;
      if (uVar11 == 0) {
        error_printf("basisu_frontend: verify check failed at line %i!\n",0x888);
        abort();
      }
      pvVar8 = this_00->m_p + uVar12;
      puVar9 = pvVar8->m_p;
      lVar5 = 0x3f;
      if (uVar11 != 0) {
        for (; uVar4 >> lVar5 == 0; lVar5 = lVar5 + -1) {
        }
      }
      std::__introsort_loop<unsigned_int*,long,__gnu_cxx::__ops::_Iter_less_iter>
                (puVar9,puVar9 + uVar11,((uint)lVar5 ^ 0x3f) * 2 ^ 0x7e);
      std::__final_insertion_sort<unsigned_int*,__gnu_cxx::__ops::_Iter_less_iter>
                (puVar9,puVar9 + uVar11);
      puVar7 = pvVar8->m_p;
      uVar11 = (ulong)pvVar8->m_size;
      puVar9 = puVar7 + uVar11;
      if (uVar11 == 0) {
        uVar11 = 0;
      }
      else {
        lVar5 = uVar11 * 4 + -4;
        puVar3 = puVar7 + 1;
        do {
          puVar14 = puVar3;
          if (lVar5 == 0) goto LAB_0022e3ec;
          lVar5 = lVar5 + -4;
          puVar3 = puVar14 + 1;
        } while (puVar14[-1] != *puVar14);
        puVar9 = puVar14 + -1;
        if (lVar5 != 0) {
          lVar6 = 0;
          uVar4 = puVar14[-1];
          do {
            uVar2 = *(uint *)((long)(puVar14 + 1) + lVar6);
            if (uVar4 != uVar2) {
              puVar9[1] = uVar2;
              puVar9 = puVar9 + 1;
            }
            lVar6 = lVar6 + 4;
            uVar4 = uVar2;
          } while (lVar5 != lVar6);
          puVar7 = pvVar8->m_p;
          uVar11 = (ulong)pvVar8->m_size;
        }
        puVar9 = puVar9 + 1;
      }
LAB_0022e3ec:
      vector<unsigned_int>::erase(pvVar8,puVar9,puVar7 + uVar11);
      uVar12 = uVar12 + 1;
    } while (uVar12 < (this->m_selector_clusters_within_each_parent_cluster).m_size);
  }
  if (local_48.m_p != (void *)0x0) {
    free(local_48.m_p);
  }
  return;
}

Assistant:

void basisu_frontend::compute_selector_clusters_within_each_parent_cluster()
	{
		uint_vec block_selector_cluster_indices(m_total_blocks);

		for (int cluster_index = 0; cluster_index < static_cast<int>(m_selector_cluster_block_indices.size()); cluster_index++)
		{
			const basisu::vector<uint32_t>& cluster_indices = m_selector_cluster_block_indices[cluster_index];

			for (uint32_t cluster_indices_iter = 0; cluster_indices_iter < cluster_indices.size(); cluster_indices_iter++)
			{
				const uint32_t block_index = cluster_indices[cluster_indices_iter];
				
				block_selector_cluster_indices[block_index] = cluster_index;

			} // cluster_indices_iter

		} // cluster_index

		m_selector_clusters_within_each_parent_cluster.resize(0);
		m_selector_clusters_within_each_parent_cluster.resize(m_selector_parent_cluster_block_indices.size());

		for (uint32_t block_index = 0; block_index < m_total_blocks; block_index++)
		{
			const uint32_t cluster_index = block_selector_cluster_indices[block_index];
			const uint32_t parent_cluster_index = m_block_parent_selector_cluster[block_index];

			m_selector_clusters_within_each_parent_cluster[parent_cluster_index].push_back(cluster_index);
		}

		for (uint32_t i = 0; i < m_selector_clusters_within_each_parent_cluster.size(); i++)
		{
			uint_vec &cluster_indices = m_selector_clusters_within_each_parent_cluster[i];

			BASISU_FRONTEND_VERIFY(cluster_indices.size());

			vector_sort(cluster_indices);
			
			auto last = std::unique(cluster_indices.begin(), cluster_indices.end());
			cluster_indices.erase(last, cluster_indices.end());
		}
	}